

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Erase::_Run(_Test_Erase *this)

{
  reference pvVar1;
  size_type local_f20;
  int local_f14;
  Tester local_f10;
  int local_d70 [2];
  Tester local_d68;
  int local_bc8 [2];
  Tester local_bc0;
  int local_a1c;
  Tester local_a18;
  int local_874;
  Tester local_870;
  size_type local_6d0;
  int local_6c4;
  Tester local_6c0;
  int local_520 [2];
  Tester local_518;
  int local_378 [2];
  Tester local_370;
  size_type local_1c0;
  int local_1b4;
  Tester local_1b0;
  _Test_Erase *local_10;
  _Test_Erase *this_local;
  
  local_10 = this;
  CacheTest::Erase(&this->super_CacheTest,200);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x5c);
  local_1b4 = 0;
  local_1c0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)this);
  test::Tester::IsEq<int,unsigned_long>(&local_1b0,&local_1b4,&local_1c0);
  test::Tester::~Tester(&local_1b0);
  CacheTest::Insert(&this->super_CacheTest,100,0x65,1);
  CacheTest::Insert(&this->super_CacheTest,200,0xc9,1);
  CacheTest::Erase(&this->super_CacheTest,100);
  test::Tester::Tester
            (&local_370,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x61);
  local_378[1] = 0xffffffff;
  local_378[0] = CacheTest::Lookup(&this->super_CacheTest,100);
  test::Tester::IsEq<int,int>(&local_370,local_378 + 1,local_378);
  test::Tester::~Tester(&local_370);
  test::Tester::Tester
            (&local_518,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x62);
  local_520[1] = 0xc9;
  local_520[0] = CacheTest::Lookup(&this->super_CacheTest,200);
  test::Tester::IsEq<int,int>(&local_518,local_520 + 1,local_520);
  test::Tester::~Tester(&local_518);
  test::Tester::Tester
            (&local_6c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,99);
  local_6c4 = 1;
  local_6d0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)this);
  test::Tester::IsEq<int,unsigned_long>(&local_6c0,&local_6c4,&local_6d0);
  test::Tester::~Tester(&local_6c0);
  test::Tester::Tester
            (&local_870,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,100);
  local_874 = 100;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this,0);
  test::Tester::IsEq<int,int>(&local_870,&local_874,pvVar1);
  test::Tester::~Tester(&local_870);
  test::Tester::Tester
            (&local_a18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x65);
  local_a1c = 0x65;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(this->super_CacheTest).deleted_values_,0);
  test::Tester::IsEq<int,int>(&local_a18,&local_a1c,pvVar1);
  test::Tester::~Tester(&local_a18);
  CacheTest::Erase(&this->super_CacheTest,100);
  test::Tester::Tester
            (&local_bc0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x68);
  local_bc8[1] = 0xffffffff;
  local_bc8[0] = CacheTest::Lookup(&this->super_CacheTest,100);
  test::Tester::IsEq<int,int>(&local_bc0,local_bc8 + 1,local_bc8);
  test::Tester::~Tester(&local_bc0);
  test::Tester::Tester
            (&local_d68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x69);
  local_d70[1] = 0xc9;
  local_d70[0] = CacheTest::Lookup(&this->super_CacheTest,200);
  test::Tester::IsEq<int,int>(&local_d68,local_d70 + 1,local_d70);
  test::Tester::~Tester(&local_d68);
  test::Tester::Tester
            (&local_f10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x6a);
  local_f14 = 1;
  local_f20 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)this);
  test::Tester::IsEq<int,unsigned_long>(&local_f10,&local_f14,&local_f20);
  test::Tester::~Tester(&local_f10);
  return;
}

Assistant:

TEST(CacheTest, Erase) {
  Erase(200);
  ASSERT_EQ(0, deleted_keys_.size());

  Insert(100, 101);
  Insert(200, 201);
  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
}